

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O2

void __thiscall
tst_deprecations_helpers_qpromiseall::allPromisesSucceed_void
          (tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  PromiseData<void> *this_00;
  QThread *p_00;
  QObject *pQVar5;
  QEvent *this_01;
  long lVar6;
  initializer_list<QtPromise::QPromise<void>_> args;
  QArrayDataPointer<QtPromise::QPromise<void>_> local_c8;
  QPromise<void> p;
  QPromise<void> p2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_90;
  QPromiseBase<void> local_88;
  undefined **local_78;
  PromiseData<void> *local_70;
  undefined **local_68;
  PromiseData<void> *local_60;
  QWeakPointer<QObject> local_58;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_48;
  QPromise<void> p1;
  QPromise<void> p0;
  
  QtPromise::resolve();
  QtPromise::resolve();
  p2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128920;
  this_00 = (PromiseData<void> *)operator_new(0x58);
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_00->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128980;
  p2.super_QPromiseBase<void>.m_d.d = this_00;
  local_88.m_d.d = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&p,(QPromise<void> *)&local_88);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_88);
  if (p.super_QPromiseBase<void>._vptr_QPromiseBase == (_func_int **)0x0) {
    p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)p.super_QPromiseBase<void>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<void>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  local_90.d = (Data *)0x0;
  if ((Data *)p.super_QPromiseBase<void>._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QArrayData *)&((Data *)p.super_QPromiseBase<void>._vptr_QPromiseBase)->super_QSharedData)->
    ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&((Data *)p.super_QPromiseBase<void>._vptr_QPromiseBase)->super_QSharedData
          )->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.d = (Data *)p.super_QPromiseBase<void>._vptr_QPromiseBase;
  local_48.d = (Data *)p.super_QPromiseBase<void>._vptr_QPromiseBase;
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_58,p_00);
  if (((local_58.d != (Data *)0x0) &&
      (local_58.value != (QObject *)0x0 &&
       ((local_58.d)->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
     (cVar2 = QThread::isFinished(), cVar2 == '\0')) {
    if ((local_58.d == (Data *)0x0) ||
       (((local_58.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
      local_58.value = (QObject *)0x0;
    }
    pQVar5 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_58.value);
    if ((pQVar5 != (QObject *)0x0) || (cVar2 = QCoreApplication::closingDown(), cVar2 == '\0')) {
      this_01 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(this_01,None);
      *(undefined ***)this_01 = &PTR__Event_00128728;
      *(Data **)(this_01 + 0x10) = local_c8.d;
      if ((Data *)local_c8.d != (Data *)0x0) {
        LOCK();
        ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar5,this_01,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_58);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_48);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_90);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&p);
  p2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128980;
  local_88.m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
                 p0.super_QPromiseBase<void>.m_d.d;
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128980;
  local_70 = p2.super_QPromiseBase<void>.m_d.d;
  if (p2.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78 = &PTR__QPromiseBase_00128980;
  local_60 = p1.super_QPromiseBase<void>.m_d.d;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = &PTR__QPromiseBase_00128980;
  args._M_len = 3;
  args._M_array = (iterator)&local_88;
  QList<QtPromise::QPromise<void>_>::QList((QList<QtPromise::QPromise<void>_> *)&local_c8,args);
  QtPromise::all<QList>((QtPromise *)&p,(QList<QtPromise::QPromise<void>_> *)&local_c8);
  QArrayDataPointer<QtPromise::QPromise<void>_>::~QArrayDataPointer(&local_c8);
  lVar6 = 0x20;
  do {
    QtPromise::QPromiseBase<void>::~QPromiseBase
              ((QPromiseBase<void> *)((long)&local_88._vptr_QPromiseBase + lVar6));
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != -0x10);
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  local_88._vptr_QPromiseBase = (_func_int **)CONCAT71(local_88._vptr_QPromiseBase._1_7_,bVar3);
  local_c8.d = (Data *)CONCAT71(local_c8.d._1_7_,1);
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)&local_88,(bool *)&local_c8,"p0.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x82);
  if (bVar3) {
    bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                      (&(p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    local_88._vptr_QPromiseBase = (_func_int **)CONCAT71(local_88._vptr_QPromiseBase._1_7_,bVar3);
    local_c8.d = (Data *)CONCAT71(local_c8.d._1_7_,1);
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&local_88,(bool *)&local_c8,"p1.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x83);
    if (bVar3) {
      bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                        (&(p2.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>)
      ;
      local_88._vptr_QPromiseBase = (_func_int **)CONCAT71(local_88._vptr_QPromiseBase._1_7_,bVar3);
      local_c8.d = (Data *)CONCAT71(local_c8.d._1_7_,1);
      bVar3 = QTest::qCompare<bool,bool>
                        ((bool *)&local_88,(bool *)&local_c8,"p2.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0x84);
      if (bVar3) {
        bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                          (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                          );
        local_88._vptr_QPromiseBase =
             (_func_int **)CONCAT71(local_88._vptr_QPromiseBase._1_7_,bVar3);
        local_c8.d = (Data *)CONCAT71(local_c8.d._1_7_,1);
        bVar3 = QTest::qCompare<bool,bool>
                          ((bool *)&local_88,(bool *)&local_c8,"p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0x85);
        if (bVar3) {
          local_88._vptr_QPromiseBase =
               (_func_int **)CONCAT44(local_88._vptr_QPromiseBase._4_4_,0xffffffff);
          local_c8.d = (Data *)CONCAT44(local_c8.d._4_4_,0x2a);
          iVar4 = waitForValue<int>(&p,(int *)&local_88,(int *)&local_c8);
          cVar2 = QTest::qCompare(iVar4,0x2a,"waitForValue(p, -1, 42)","42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                  ,0x86);
          if (cVar2 != '\0') {
            bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                              (&(p2.super_QPromiseBase<void>.m_d.d)->
                                super_PromiseDataBase<void,_void_()>);
            local_88._vptr_QPromiseBase =
                 (_func_int **)CONCAT71(local_88._vptr_QPromiseBase._1_7_,bVar3);
            local_c8.d = (Data *)CONCAT71(local_c8.d._1_7_,1);
            QTest::qCompare<bool,bool>
                      ((bool *)&local_88,(bool *)&local_c8,"p2.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x87);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p2.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p1.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p0.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::allPromisesSucceed_void()
{
    auto p0 = QtPromise::resolve();
    auto p1 = QtPromise::resolve();
    auto p2 = QtPromise::QPromise<void>{[](const QtPromise::QPromiseResolve<void>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve();
        });
    }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<void>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1, 42), 42);
    QCOMPARE(p2.isFulfilled(), true);
}